

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Defer.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_e9b7::DeferTest_basic_Test::~DeferTest_basic_Test(DeferTest_basic_Test *this)

{
  DeferTest_basic_Test *this_local;
  
  ~DeferTest_basic_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(DeferTest, basic) {
  int defer_count = 0;

  // Test basic macro use
  {
    llbuild_defer { defer_count++; };
    EXPECT_EQ(0, defer_count);
  }
  EXPECT_EQ(1, defer_count);

  // Test multiple defers
  defer_count = 0;
  {
    llbuild_defer { defer_count += 1; };
    EXPECT_EQ(0, defer_count);
    llbuild_defer { defer_count += 2; };
    EXPECT_EQ(0, defer_count);
  }
  EXPECT_EQ(3, defer_count);

  // Test/show direct use of RAII builder
  defer_count = 0;
  {
    auto deferred = makeScopeDefer([&](){ defer_count += 1; });
    EXPECT_EQ(0, defer_count);
  }
  EXPECT_EQ(1, defer_count);

  // Test/show direct use of ScopeDefer template
  defer_count = 0;
  {
    auto deferred = ScopeDefer<std::function<void()>>([&](){ defer_count += 1; });
    EXPECT_EQ(0, defer_count);
  }
  EXPECT_EQ(1, defer_count);
}